

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBEx.cpp
# Opt level: O1

bool __thiscall
ADSBExchangeConnection::ProcessErrors(ADSBExchangeConnection *this,JSON_Object *pObj)

{
  int iVar1;
  char *pcVar2;
  char *__s;
  bool bVar3;
  string errTxt;
  allocator<char> local_49;
  long *local_48;
  char *local_40;
  long local_38 [2];
  
  pcVar2 = jog_s(pObj,"message");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,pcVar2,&local_49);
  if (local_40 == (char *)0x0) {
    __s = jog_s(pObj,"msg");
    pcVar2 = local_40;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_48,0,pcVar2,(ulong)__s);
  }
  bVar3 = true;
  if (local_40 != (char *)0x0) {
    iVar1 = std::__cxx11::string::compare((char *)&local_48);
    if (iVar1 != 0) {
      if ((int)dataRefs.iLogLevel < 4) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
               ,0x1d7,"ProcessErrors",logERR,"ADS-B Exchange: Received an ERRor response: %s",
               local_48);
      }
      (*(this->super_ADSBBase).super_LTFlightDataChannel.super_LTOnlineChannel.super_LTChannel.
        _vptr_LTChannel[8])(this);
      bVar3 = false;
    }
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return bVar3;
}

Assistant:

bool ADSBExchangeConnection::ProcessErrors (const JSON_Object* pObj)
{
    // test for non-OK response in 'message' / 'msg'
    std::string errTxt = jog_s(pObj, ADSBEX_MESSAGE);
    if (errTxt.empty())
        errTxt = jog_s(pObj, ADSBEX_MSG);    
    if (!errTxt.empty() && errTxt != ADSBEX_SUCCESS)
    {
        LOG_MSG(logERR, ERR_ADSBEX_OTHER, errTxt.c_str());
        IncErrCnt();
        return false;
    }
    
    // Looks OK
    return true;
}